

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O0

void __thiscall OpenMD::NPrT::NPrT(NPrT *this,SimInfo *info)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  SimInfo *in_stack_00000078;
  NPT *in_stack_00000080;
  Globals *simParams;
  undefined5 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  Globals *local_28;
  
  NPT::NPT(in_stack_00000080,in_stack_00000078);
  *in_RDI = &PTR__NPrT_00506e20;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x212531);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x212549);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x212561);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x212579);
  local_28 = SimInfo::getSimParams((SimInfo *)in_RDI[0xe]);
  bVar1 = Globals::haveSurfaceTension((Globals *)0x2125aa);
  if (bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Globals::getSurfaceTension((Globals *)0x21268c);
    in_RDI[0x65] = (double)__lhs * 1.439326479 * 0.0004184;
    Globals::getPrivilegedAxis_abi_cxx11_
              ((Globals *)
               CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,
                                 CONCAT15(in_stack_ffffffffffffff2d,in_stack_ffffffffffffff28))));
    bVar2 = std::operator==(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff2f,
                                                   CONCAT16(in_stack_ffffffffffffff2e,
                                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                                     in_stack_ffffffffffffff28))));
    std::__cxx11::string::~string(local_48);
    if ((bVar2 & 1) == 0) {
      Globals::getPrivilegedAxis_abi_cxx11_
                ((Globals *)
                 CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff2e,
                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                  in_stack_ffffffffffffff28))));
      bVar3 = std::operator==(__lhs,(char *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff2e,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff2d,
                                                  in_stack_ffffffffffffff28))));
      std::__cxx11::string::~string(local_68);
      if ((bVar3 & 1) == 0) {
        Globals::getPrivilegedAxis_abi_cxx11_
                  ((Globals *)
                   CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(in_stack_ffffffffffffff2d,
                                                          in_stack_ffffffffffffff28))));
        bVar2 = std::operator==(__lhs,(char *)CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(
                                                  in_stack_ffffffffffffff2d,
                                                  in_stack_ffffffffffffff28))));
        std::__cxx11::string::~string(local_88);
        if ((bVar2 & 1) != 0) {
          *(undefined4 *)(in_RDI + 0x66) = 2;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x66) = 1;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x66) = 0;
    }
    *(uint *)((long)in_RDI + 0x334) = (*(int *)(in_RDI + 0x66) + 1U) % 3;
    *(uint *)(in_RDI + 0x67) = (*(int *)(in_RDI + 0x66) + 2U) % 3;
  }
  else {
    snprintf(painCave.errMsg,2000,"If you use the NPT integrator, you must set tauBarostat.\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

NPrT::NPrT(SimInfo* info) : NPT(info) {
    Globals* simParams = info_->getSimParams();
    if (!simParams->haveSurfaceTension()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the NPT integrator, you must set tauBarostat.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      surfaceTension_ = simParams->getSurfaceTension() *
                        Constants::surfaceTensionConvert *
                        Constants::energyConvert;

      // Default value of privilegedAxis is "z"
      if (simParams->getPrivilegedAxis() == "x")
        axis_ = 0;
      else if (simParams->getPrivilegedAxis() == "y")
        axis_ = 1;
      else if (simParams->getPrivilegedAxis() == "z")
        axis_ = 2;

      // Compute complementary axes to the privileged axis
      axis1_ = (axis_ + 1) % 3;
      axis2_ = (axis_ + 2) % 3;
    }
  }